

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          either<toml::detail::in_range<(char)0,(char)8>,toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  bool bVar1;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  undefined1 local_68 [8];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)this;
  in_range<(char)0,(char)8>::invoke<std::vector<char,std::allocator<char>>>
            ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)local_68,(in_range<(char)0,(char)8> *)this,loc);
  bVar1 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
          ::is_ok((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                   *)local_68);
  if (bVar1) {
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,
           (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            *)local_68);
  }
  else {
    either<toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
    ::invoke<std::vector<char,std::allocator<char>>>
              (__return_storage_ptr__,
               (either<toml::detail::in_range<(char)16,(char)31>,toml::detail::character<(char)127>,toml::detail::repeat<toml::detail::character<(char)39>,toml::detail::exactly<3ul>>>
                *)rslt.field_1.succ.value.last_._M_current,loc_00);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  ~result((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }